

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

String * __thiscall
glcts::LayoutBindingBaseCase::buildAccess
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this,String *var)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  undefined4 extraout_var_00;
  ostringstream s;
  ostream local_190;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  poVar2 = std::operator<<(&local_190,*(char **)(CONCAT44(extraout_var,iVar1) + 0x28));
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = std::operator<<(poVar2,(string *)var);
  poVar2 = std::operator<<(poVar2,",");
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  poVar2 = std::operator<<(poVar2,*(char **)(CONCAT44(extraout_var_00,iVar1) + 0x20));
  poVar2 = std::operator<<(poVar2,"(0)");
  std::operator<<(poVar2,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

virtual String buildAccess(const String& var)
	{
		std::ostringstream s;
		s << getTestParameters().access_function << "(" << var << "," << getTestParameters().coord_vector_type << "(0)"
		  << ")";
		return s.str();
	}